

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O2

void __thiscall
spdlog::details::source_location_formatter::format
          (source_location_formatter *this,log_msg *msg,tm *param_2,memory_buffer *dest)

{
  uint32_t n;
  size_t sVar1;
  fmt_helper *pfVar2;
  uint uVar3;
  char *pcVar4;
  memory_buffer *pmVar5;
  string_view_t view;
  string_view_t view_00;
  scoped_pad p;
  char local_59;
  scoped_pad local_58;
  
  n = (msg->source).line;
  if (n != 0) {
    sVar1 = (this->super_flag_formatter).padinfo_.width_;
    pfVar2 = (fmt_helper *)(msg->source).filename;
    pmVar5 = dest;
    pcVar4 = (char *)strlen((char *)pfVar2);
    if (sVar1 == 0) {
      view_00.size_ = (size_t)dest;
      view_00.data_ = pcVar4;
      fmt_helper::append_string_view<500ul>(pfVar2,view_00,pmVar5);
      local_58.padinfo_._0_1_ = 0x3a;
      fmt::v5::internal::basic_buffer<char>::push_back
                (&dest->super_basic_buffer<char>,(char *)&local_58);
      fmt_helper::append_int<unsigned_int,500ul>((msg->source).line,dest);
    }
    else {
      uVar3 = fmt::v5::internal::count_digits(n);
      pmVar5 = dest;
      scoped_pad::scoped_pad
                (&local_58,(size_t)(pcVar4 + (ulong)uVar3 + 1),
                 &(this->super_flag_formatter).padinfo_,dest);
      pfVar2 = (fmt_helper *)(msg->source).filename;
      pcVar4 = (char *)strlen((char *)pfVar2);
      view.size_ = (size_t)dest;
      view.data_ = pcVar4;
      fmt_helper::append_string_view<500ul>(pfVar2,view,pmVar5);
      local_59 = ':';
      fmt::v5::internal::basic_buffer<char>::push_back(&dest->super_basic_buffer<char>,&local_59);
      fmt_helper::append_int<unsigned_int,500ul>((msg->source).line,dest);
      scoped_pad::~scoped_pad(&local_58);
    }
  }
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, fmt::memory_buffer &dest) override
    {
        string_view_t field_value{full_days[tm_time.tm_wday]};
        scoped_pad p(field_value, padinfo_, dest);
        fmt_helper::append_string_view(field_value, dest);
    }